

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

string * __thiscall
cmCustomCommandGenerator::GetFullDepfile_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this)

{
  bool bVar1;
  ulong uVar2;
  string *str;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  string local_70;
  undefined4 local_50;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string depfile;
  cmCustomCommandGenerator *this_local;
  
  depfile.field_2._8_8_ = this;
  GetDepfile_abi_cxx11_((string *)local_38,this);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_38);
    if (!bVar1) {
      str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LG);
      cmAlphaNum::cmAlphaNum(&local_a0,str);
      cmAlphaNum::cmAlphaNum(&local_d0,'/');
      cmStrCat<std::__cxx11::string>
                (&local_70,&local_a0,&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
      std::__cxx11::string::operator=((string *)local_38,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,(string *)local_38);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_39);
    std::allocator<char>::~allocator(&local_39);
  }
  local_50 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetFullDepfile() const
{
  std::string depfile = this->GetDepfile();
  if (depfile.empty()) {
    return "";
  }

  if (!cmSystemTools::FileIsFullPath(depfile)) {
    depfile = cmStrCat(this->LG->GetCurrentBinaryDirectory(), '/', depfile);
  }
  return cmSystemTools::CollapseFullPath(depfile);
}